

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O1

void __thiscall Restaurant::start(Restaurant *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  string action1;
  string delimiter;
  string token;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Restaurant is now open!\n",0x18);
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130," ","");
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  bVar1 = true;
  do {
    local_148 = 0;
    local_140[0] = 0;
    local_150 = local_140;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please enter an Action you want to do: \n",0x28);
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'p');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_150,cVar2);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::find((char *)&local_150,(ulong)local_130[0],0);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_150);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    std::__cxx11::string::erase((ulong)&local_150,0);
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 == 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_150,local_150 + local_148)
      ;
      goOpen(this,&local_90);
      paVar4 = &local_90.field_2;
      _Var5._M_p = local_90._M_dataplus._M_p;
LAB_00109f81:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != paVar4) {
        operator_delete(_Var5._M_p);
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 == 0) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_150,local_150 + local_148);
        goOrder(this,&local_b0);
        paVar4 = &local_b0.field_2;
        _Var5._M_p = local_b0._M_dataplus._M_p;
        goto LAB_00109f81;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 == 0) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_150,local_150 + local_148);
        goMove(this,&local_d0);
        paVar4 = &local_d0.field_2;
        _Var5._M_p = local_d0._M_dataplus._M_p;
        goto LAB_00109f81;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 == 0) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_150,local_150 + local_148);
        goClose(this,&local_f0);
        paVar4 = &local_f0.field_2;
        _Var5._M_p = local_f0._M_dataplus._M_p;
        goto LAB_00109f81;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 == 0) {
        goCloseAll(this);
        bVar1 = false;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar3 == 0) {
          goMenu(this);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar3 == 0) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,local_150,local_150 + local_148);
            goStatus(this,&local_110);
            paVar4 = &local_110.field_2;
            _Var5._M_p = local_110._M_dataplus._M_p;
            goto LAB_00109f81;
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar3 == 0) {
            goLog(this);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_70);
            if (iVar3 == 0) {
              goBackup(this);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_70);
              if (iVar3 == 0) {
                goRestore(this);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Wrong input, try again \n",0x18);
              }
            }
          }
        }
      }
    }
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    if (!bVar1) {
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_130[0] != local_120) {
        operator_delete(local_130[0]);
      }
      return;
    }
  } while( true );
}

Assistant:

void Restaurant::start()
{
    std::cout << "Restaurant is now open!\n";
    bool restOpen(true);
    //std::string action;
    std::string delimiter = " ";
    size_t pos = 0;
    std::string token;
    while (restOpen)
    {
        std::string action1;
        std::cout << "Please enter an Action you want to do: \n";
        std::getline(std::cin, action1);
        action1 += " ";
        pos = action1.find(delimiter);
        token = action1.substr(0, pos);
        action1.erase(0, pos + delimiter.length());
        if(token == "open")
            goOpen(action1);
        else if(token == "order")
            goOrder(action1);
        else if(token == "move")
            goMove(action1);
        else if(token == "close")
            goClose(action1);
        else if (token == "closeall") {
            goCloseAll();
            restOpen = false;
        }
        else if (token == "menu")
            goMenu();
        else if (token == "status")
            goStatus(action1);
        else if (token == "log")
            goLog();
        else if (token == "backup")
            goBackup();
        else if (token == "restore")
            goRestore();
        else
            std::cout << "Wrong input, try again \n";
    }
}